

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>::
ReadColumnSizes<true>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>
           *this)

{
  CStringRef arg0;
  CStringRef arg0_00;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_RDI;
  int size;
  int i;
  int prev_size;
  ColumnSizeHandler size_handler;
  int num_sizes;
  undefined8 in_stack_ffffffffffffffb8;
  ColumnSizeHandler *in_stack_ffffffffffffffc0;
  BasicCStringRef<char> in_stack_ffffffffffffffd0;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar3 = *(int *)in_RDI[1] + -1;
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     in_stack_ffffffffffffffd0.data_);
  if (iVar1 != iVar3) {
    in_stack_ffffffffffffffc0 = (ColumnSizeHandler *)*in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"expected {}");
    arg0.data_._4_4_ = iVar3;
    arg0.data_._0_4_ = in_stack_fffffffffffffff0;
    BinaryReaderBase::ReportError<int>
              ((BinaryReaderBase *)in_stack_ffffffffffffffe8.data_,arg0,
               (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  NLHandler<mp::NullNLHandler<int>,_int>::OnColumnSizes
            ((NLHandler<mp::NullNLHandler<int>,_int> *)0x13f8cb);
  iVar1 = 0;
  for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
    iVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                      ((BinaryReader<mp::internal::EndiannessConverter> *)
                       in_stack_ffffffffffffffd0.data_);
    if (iVar2 < iVar1) {
      in_stack_ffffffffffffffb8 = *in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffd0,"invalid column offset");
      arg0_00.data_._4_4_ = iVar3;
      arg0_00.data_._0_4_ = in_stack_fffffffffffffff0;
      BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_ffffffffffffffe8.data_,arg0_00);
    }
    NLHandler<mp::NullNLHandler<int>,_int>::ColumnSizeHandler::Add
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    iVar1 = iVar2;
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}